

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::_InternalSerialize
          (BiDirectionalLSTMLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  bool bVar2;
  uint8_t *puVar3;
  Type *pTVar4;
  ulong uVar5;
  Type *this_00;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  LSTMParams *this_01;
  size_t __n;
  
  uVar6 = this->inputvectorsize_;
  if (uVar6 != 0) {
    puVar3 = target;
    if (stream->end_ <= target) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar6 = this->inputvectorsize_;
    }
    *puVar3 = '\b';
    puVar3[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      target = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar6 | 0x80;
      puVar3[2] = (uint8_t)(uVar6 >> 7);
      target = puVar3 + 3;
      if (0x3fff < uVar6) {
        uVar8 = (ulong)puVar3[2];
        uVar6 = uVar6 >> 7;
        do {
          target[-1] = (byte)uVar8 | 0x80;
          uVar5 = uVar6 >> 7;
          *target = (uint8_t)uVar5;
          target = target + 1;
          uVar8 = uVar5 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar2);
      }
    }
  }
  uVar6 = this->outputvectorsize_;
  puVar3 = target;
  if (uVar6 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar6 = this->outputvectorsize_;
    }
    *target = '\x10';
    target[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar3 = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      target[2] = (uint8_t)(uVar6 >> 7);
      puVar3 = target + 3;
      if (0x3fff < uVar6) {
        uVar8 = (ulong)target[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar3[-1] = (byte)uVar8 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar8 = uVar5 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar2);
      }
    }
  }
  iVar7 = (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= puVar3) {
        puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      }
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                         (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,iVar9);
      *puVar3 = 'R';
      uVar1 = (pTVar4->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar3[1] = (uint8_t)uVar1;
      if (uVar1 < 0x80) {
        puVar3 = puVar3 + 2;
      }
      else {
        puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar1,puVar3 + 1);
      }
      puVar3 = ActivationParams::_InternalSerialize(pTVar4,puVar3,stream);
      iVar9 = iVar9 + 1;
    } while (iVar7 != iVar9);
  }
  iVar7 = (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= puVar3) {
        puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      }
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                         (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,iVar9);
      *puVar3 = 'Z';
      uVar1 = (pTVar4->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar3[1] = (uint8_t)uVar1;
      if (uVar1 < 0x80) {
        puVar3 = puVar3 + 2;
      }
      else {
        puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar1,puVar3 + 1);
      }
      puVar3 = ActivationParams::_InternalSerialize(pTVar4,puVar3,stream);
      iVar9 = iVar9 + 1;
    } while (iVar7 != iVar9);
  }
  this_01 = this->params_;
  if (this != (BiDirectionalLSTMLayerParams *)_BiDirectionalLSTMLayerParams_default_instance_ &&
      this_01 != (LSTMParams *)0x0) {
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      this_01 = this->params_;
    }
    *puVar3 = 'z';
    uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar3[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar3 = puVar3 + 2;
    }
    else {
      puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,puVar3 + 1);
    }
    puVar3 = LSTMParams::_InternalSerialize(this_01,puVar3,stream);
  }
  iVar7 = (this->weightparams_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= puVar3) {
        puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                          (&(this->weightparams_).super_RepeatedPtrFieldBase,iVar9);
      puVar3[0] = 0xa2;
      puVar3[1] = '\x01';
      uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar3[2] = (uint8_t)uVar1;
      if (uVar1 < 0x80) {
        puVar3 = puVar3 + 3;
      }
      else {
        puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar1,puVar3 + 2);
      }
      puVar3 = LSTMWeightParams::_InternalSerialize(this_00,puVar3,stream);
      iVar9 = iVar9 + 1;
    } while (iVar7 != iVar9);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    data = *(void **)(uVar6 + 8);
    iVar7 = (int)*(undefined8 *)(uVar6 + 0x10);
    __n = (size_t)iVar7;
    if ((long)stream->end_ - (long)puVar3 < (long)__n) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,iVar7,puVar3)
      ;
      return puVar3;
    }
    memcpy(puVar3,data,__n);
    puVar3 = puVar3 + __n;
  }
  return puVar3;
}

Assistant:

uint8_t* BiDirectionalLSTMLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->_internal_inputvectorsize() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(1, this->_internal_inputvectorsize(), target);
  }

  // uint64 outputVectorSize = 2;
  if (this->_internal_outputvectorsize() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_outputvectorsize(), target);
  }

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_activationsforwardlstm_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(10, this->_internal_activationsforwardlstm(i), target, stream);
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_activationsbackwardlstm_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(11, this->_internal_activationsbackwardlstm(i), target, stream);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->_internal_has_params()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        15, _Internal::params(this), target, stream);
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_weightparams_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(20, this->_internal_weightparams(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BiDirectionalLSTMLayerParams)
  return target;
}